

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::Parser::LineContents::reset_with_next_line(LineContents *this,csubstr buf,size_t offset)

{
  char *s_;
  code *pcVar1;
  LineContents *pLVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  size_t len_;
  basic_substring<const_char> local_68;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  char *local_40;
  LineContents *local_38;
  
  uVar5 = buf.len;
  local_38 = this;
  if (uVar5 < offset) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    local_68.str = (char *)0x0;
    local_68.len = 0x767c;
    local_58 = 0;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: offset <= buf.len",0x1f,(anonymous_namespace)::s_default_callbacks);
  }
  if (uVar5 <= offset) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  s_ = buf.str + offset;
  pcVar7 = buf.str + uVar5;
  pcVar8 = s_;
  if ((long)offset < (long)uVar5) {
    do {
      if ((*pcVar8 == '\n') || (*pcVar8 == '\r')) break;
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 < pcVar7);
  }
  uVar6 = (long)pcVar8 - (long)s_;
  if (pcVar8 < s_) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    local_68.str = (char *)0x0;
    local_68.len = 0x7682;
    local_58 = 0;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: e >= b",0x14,(anonymous_namespace)::s_default_callbacks);
  }
  if (uVar5 < offset) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153a,"first >= 0 && first <= len");
  }
  if (uVar6 != 0xffffffffffffffff && uVar5 < uVar6) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
  }
  if (uVar6 == 0xffffffffffffffff) {
    uVar6 = uVar5 - offset;
  }
  if (pcVar8 != s_ && uVar5 < uVar6 + offset) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<const_char>::basic_substring(&local_68,s_,uVar6);
  sVar4 = local_68.len;
  if (pcVar8 != pcVar7) {
    pcVar8 = pcVar8 + (*pcVar8 == '\r');
  }
  if (pcVar8 != pcVar7) {
    pcVar8 = pcVar8 + (*pcVar8 == '\n');
  }
  local_40 = local_68.str;
  uVar6 = (long)pcVar8 - (long)s_;
  if (pcVar8 < s_) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    local_68.str = (char *)0x0;
    local_68.len = 0x7689;
    local_58 = 0;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    (*(code *)PTR_error_impl_002a27a8)
              ("check failed: e >= b",0x14,(anonymous_namespace)::s_default_callbacks);
  }
  if (uVar5 < offset) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153a,"first >= 0 && first <= len");
  }
  if (uVar6 != 0xffffffffffffffff && uVar5 < uVar6) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
  }
  len_ = uVar5 - offset;
  if (uVar6 != 0xffffffffffffffff) {
    len_ = uVar6;
  }
  if ((uVar5 < offset + len_) && (pcVar8 != s_)) {
    if (((s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    handle_error(0x250c0a,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<const_char>::basic_substring(&local_68,s_,len_);
  pLVar2 = local_38;
  (local_38->full).str = local_68.str;
  (local_38->full).len = local_68.len;
  (local_38->stripped).str = local_40;
  (local_38->stripped).len = sVar4;
  (local_38->rem).str = local_40;
  (local_38->rem).len = sVar4;
  sVar4 = basic_substring<const_char>::first_not_of(&local_38->full,' ',0);
  pLVar2->indentation = sVar4;
  return;
}

Assistant:

void Parser::LineContents::reset_with_next_line(csubstr buf, size_t offset)
{
    RYML_ASSERT(offset <= buf.len);
    char const* C4_RESTRICT b = &buf[offset];
    char const* C4_RESTRICT e = b;
    // get the current line stripped of newline chars
    while(e < buf.end() && (*e != '\n' && *e != '\r'))
        ++e;
    RYML_ASSERT(e >= b);
    const csubstr stripped_ = buf.sub(offset, static_cast<size_t>(e - b));
    // advance pos to include the first line ending
    if(e != buf.end() && *e == '\r')
        ++e;
    if(e != buf.end() && *e == '\n')
        ++e;
    RYML_ASSERT(e >= b);
    const csubstr full_ = buf.sub(offset, static_cast<size_t>(e - b));
    reset(full_, stripped_);
}